

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean MA_push_stack(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Integer IVar4;
  long lVar5;
  int iVar6;
  Pointer pcVar7;
  Integer datatype_1;
  uint uVar8;
  char *pcVar9;
  ulongi B_address;
  AD *data;
  
  ma_stats.calls[0x17] = ma_stats.calls[0x17] + 1;
  if (ma_trace != 0) {
    printf("MA: pushing \'%s\' (%d)\n",name,nelem & 0xffffffff);
  }
  if (ma_initialized == '\0') {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",name);
  }
  else {
    uVar2 = datatype - 1000;
    if (uVar2 < 0x11) {
      if (nelem < 0) {
        sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",name,nelem);
        goto LAB_0010eac1;
      }
      uVar1 = *(uint *)(datatype * 4 + 0x1df3a0);
      lVar5 = (int)uVar1 * nelem;
      iVar6 = (int)((ulong)(ma_sp + (-4 - (*(long *)(datatype * 8 + 0x1de370) + lVar5))) %
                   (ulong)(long)(int)uVar1);
      pcVar7 = ma_sp + (-4 - ((int)((iVar6 >> 0x1f & uVar1) + iVar6) + lVar5));
      if (((0 < ma_numalign) &&
          (uVar8 = ~(-1 << ((byte)ma_numalign & 0x1f)) & (uint)pcVar7, uVar8 != 0)) &&
         ((int)((long)(ulong)uVar8 % (long)(int)uVar1) == 0)) {
        pcVar7 = pcVar7 + -(ulong)uVar8;
      }
      datatype = (Integer)(ma_sp + (((ulong)((uint)pcVar7 & 7) ^ 4) - (long)pcVar7) + 0x54);
      if ((ulong)datatype <= ma_sp + -(long)ma_hp) {
        data = (AD *)(ma_sp + -datatype);
        data->datatype = uVar2;
        data->nelem = nelem;
        pcVar9 = data->name;
        if (name != (char *)0x0) {
          strncpy(pcVar9,name,0x20);
          pcVar9 = data->name + 0x1f;
        }
        *pcVar9 = '\0';
        data->client_space = pcVar7;
        data->nbytes = datatype;
        data->next = ma_sused;
        pcVar7 = data->client_space;
        ma_sused = data;
        data->checksum = (ulongi)(pcVar7 + (long)(datatype + nelem + uVar2));
        pcVar7[-4] = -0x56;
        pcVar7[-3] = -0x56;
        pcVar7[-2] = -0x56;
        pcVar7[-1] = -0x56;
        builtin_strncpy(data->client_space + (long)ma_sizeof[data->datatype] * data->nelem,"UUUU",4)
        ;
        ma_stats.sblocks = ma_stats.sblocks + 1;
        uVar2 = ma_stats.sblocks;
        if (ma_stats.sblocks < ma_stats.sblocks_max) {
          uVar2 = ma_stats.sblocks_max;
        }
        ma_stats.sbytes = ma_stats.sbytes + data->nbytes;
        uVar3 = ma_stats.sbytes;
        if (ma_stats.sbytes < ma_stats.sbytes_max) {
          uVar3 = ma_stats.sbytes_max;
        }
        ma_stats.sblocks_max = uVar2;
        ma_stats.sbytes_max = uVar3;
        ma_sp = (Pointer)data;
        IVar4 = ma_table_allocate((TableData)data);
        *memhandle = IVar4;
        return (ulong)(IVar4 != -1);
      }
      pcVar9 = "block \'%s\', not enough space to allocate %lu bytes";
    }
    else {
      pcVar9 = "block \'%s\', invalid datatype: %ld";
    }
    sprintf(ma_ebuf,pcVar9,name,datatype);
  }
LAB_0010eac1:
  ma_error(EL_Nonfatal,ET_External,"MA_push_stack",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_push_stack(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle     /* RETURN: handle for this block */)
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_sp;        /* new ma_sp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_push_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: pushing '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    balloc_before(&ar, ma_sp, &client_space, &nbytes);

    new_sp = ma_sp - nbytes;
    /* if (new_sp < ma_hp) */
    if (((ulongi)(ma_sp - ma_hp)) < nbytes)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', not enough space to allocate %lu bytes",
            name, nbytes);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }
    else
    {
        ad = (AD *)new_sp;
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    ad->client_space = client_space;
    ad->nbytes = nbytes;
    list_insert(ad, &ma_sused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_sp */
    ma_sp = new_sp;

#ifdef STATS
    ma_stats.sblocks++;
    ma_stats.sblocks_max = max(ma_stats.sblocks, ma_stats.sblocks_max);
    ma_stats.sbytes += ad->nbytes;
    ma_stats.sbytes_max = max(ma_stats.sbytes, ma_stats.sbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}